

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

wchar_t curses_getpos(wchar_t *x,wchar_t *y,nh_bool force,char *goal)

{
  int iVar1;
  wchar_t key_00;
  nh_direction nVar2;
  wchar_t key_01;
  char *pcVar3;
  wchar_t local_7c8;
  wchar_t local_7c4;
  wchar_t local_7c0;
  wchar_t local_7bc;
  wchar_t local_7b8;
  wchar_t local_7b4;
  wchar_t hi_y;
  wchar_t hi_x;
  wchar_t lo_y;
  wchar_t lo_x;
  wchar_t pass;
  wchar_t ty;
  wchar_t tx;
  wchar_t k;
  wchar_t j;
  wchar_t i;
  wchar_t my;
  wchar_t mx;
  nh_desc_buf descbuf;
  int iStack_174;
  nh_bool first_move;
  wchar_t monidx;
  wchar_t moncount;
  coord *monpos;
  void *pvStack_160;
  nh_direction dir;
  char *matching;
  char printbuf [256];
  char *cp;
  int local_40;
  wchar_t sidx;
  wchar_t dy;
  wchar_t dx;
  wchar_t key;
  wchar_t cy;
  wchar_t cx;
  wchar_t result;
  char *goal_local;
  nh_bool force_local;
  wchar_t *y_local;
  wchar_t *x_local;
  
  pvStack_160 = (void *)0x0;
  _monidx = (void *)0x0;
  descbuf.effectdesc[0xff] = '\x01';
  werase(statuswin);
  iVar1 = wmove(statuswin,0);
  if (iVar1 != -1) {
    waddnstr(statuswin,"Select a target location with the cursor: \'.\' to confirm",0xffffffff);
  }
  if (force == '\0') {
    waddnstr(statuswin,", ESC to cancel.",0xffffffff);
  }
  else {
    waddnstr(statuswin,".",0xffffffff);
  }
  iVar1 = wmove(statuswin,1,0);
  if (iVar1 != -1) {
    waddnstr(statuswin,"Press \'?\' for help and tips.",0xffffffff);
  }
  wrefresh(statuswin);
  if (*x < L'\x01') {
    local_7b4 = player.x;
  }
  else {
    local_7b4 = *x;
  }
  key = local_7b4;
  if (*y < L'\0') {
    local_7b8 = player.y;
  }
  else {
    local_7b8 = *y;
  }
  dx = local_7b8;
  wmove(mapwin,local_7b8,local_7b4 + L'\xffffffff');
  while( true ) {
    if (descbuf.effectdesc[0xff] == '\0') {
      i = L'\0';
      j = L'\0';
      nh_describe_pos(key,dx,&my);
      werase(statuswin);
      place_desc_message((WINDOW *)statuswin,&i,&j,descbuf.invisdesc + 0xf8);
      place_desc_message((WINDOW *)statuswin,&i,&j,descbuf.mondesc + 0xf8);
      place_desc_message((WINDOW *)statuswin,&i,&j,descbuf.objdesc + 0xf8);
      place_desc_message((WINDOW *)statuswin,&i,&j,descbuf.trapdesc + 0xf8);
      place_desc_message((WINDOW *)statuswin,&i,&j,descbuf.bgdesc + 0xf8);
      place_desc_message((WINDOW *)statuswin,&i,&j,(char *)&my);
      wrefresh(statuswin);
      wmove(mapwin,dx,key + L'\xffffffff');
    }
    else {
      descbuf.effectdesc[0xff] = '\0';
    }
    local_40 = 0;
    sidx = L'\0';
    key_00 = get_map_key(L'\0');
    if (key_00 == L'\x1b') break;
    pcVar3 = strchr(" \r\n.,;:",(int)(char)key_00);
    if (pcVar3 != (char *)0x0) {
      cy = curses_getpos::pick_vals[(long)(pcVar3 + -0x124350)];
LAB_0010f14b:
      *x = key;
      *y = dx;
      if (_monidx != (void *)0x0) {
        free(_monidx);
      }
      if (pvStack_160 != (void *)0x0) {
        free(pvStack_160);
      }
      curses_update_status((nh_player_info *)0x0);
      return cy;
    }
    nVar2 = key_to_dir(key_00);
    if (nVar2 == DIR_NONE) {
      key_01 = tolower(key_00 & 0xff);
      nVar2 = key_to_dir(key_01);
      if (nVar2 != DIR_NONE) {
        sidx = xdir[nVar2] << 3;
        local_40 = ydir[nVar2] << 3;
      }
    }
    else {
      sidx = xdir[nVar2];
      local_40 = ydir[nVar2];
    }
    if ((sidx == L'\0') && (local_40 == 0)) {
      if ((key_00 == L'm') || (key_00 == L'M')) {
        if (_monidx == (void *)0x0) {
          iStack_174 = 0;
          for (k = L'\0'; k < L'\x15'; k = k + L'\x01') {
            for (tx = L'\0'; tx < L'P'; tx = tx + L'\x01') {
              if ((display_buffer[k][tx].mon != 0) && ((tx != player.x || (k != player.y)))) {
                iStack_174 = iStack_174 + 1;
              }
            }
          }
          _monidx = malloc((long)iStack_174 << 3);
          descbuf.objcount = L'\0';
          for (k = L'\0'; k < L'\x15'; k = k + L'\x01') {
            for (tx = L'\0'; tx < L'P'; tx = tx + L'\x01') {
              if ((display_buffer[k][tx].mon != 0) && ((tx != player.x || (k != player.y)))) {
                *(wchar_t *)((long)_monidx + (long)descbuf.objcount * 8) = tx;
                *(wchar_t *)((long)_monidx + (long)descbuf.objcount * 8 + 4) = k;
                descbuf.objcount = descbuf.objcount + L'\x01';
              }
            }
          }
          qsort(_monidx,(long)iStack_174,8,compare_coord_dist);
          descbuf.objcount = L'\x01';
          if (key_00 == L'm') {
            descbuf.objcount = L'\xffffffff';
          }
        }
        if (iStack_174 != 0) {
          if (key_00 == L'm') {
            descbuf.objcount = (descbuf.objcount + L'\x01') % iStack_174;
          }
          else {
            descbuf.objcount = descbuf.objcount + L'\xffffffff';
            if (descbuf.objcount < L'\0') {
              descbuf.objcount = iStack_174 + descbuf.objcount;
            }
          }
          key = *(wchar_t *)((long)_monidx + (long)descbuf.objcount * 8);
          dx = *(wchar_t *)((long)_monidx + (long)descbuf.objcount * 8 + 4);
        }
      }
      else if (key_00 == L'@') {
        key = player.x;
        dx = player.y;
      }
      else if (key_00 == L'?') {
        curses_display_menu((nh_menuitem_conflict *)curses_getpos::helpitems,L'\x15',
                            "Targeting Help (default keys)",L'\0',(wchar_t *)0x0);
      }
      else {
        ty = L'\0';
        pvStack_160 = malloc((long)default_drawing->num_bgelements);
        memset(pvStack_160,0,(long)default_drawing->num_bgelements);
        for (cp._4_4_ = default_drawing->bg_feature_offset;
            cp._4_4_ < default_drawing->num_bgelements; cp._4_4_ = cp._4_4_ + L'\x01') {
          if (key_00 == default_drawing->bgelements[cp._4_4_].ch) {
            ty = ty + L'\x01';
            *(char *)((long)pvStack_160 + (long)cp._4_4_) = (char)ty;
          }
        }
        if ((ty == L'\0') && (key_00 != L'^')) {
          pcVar3 = "(\'?\' for help)";
          if (force == '\0') {
            pcVar3 = "(ESC to abort, \'?\' for help)";
          }
          sprintf((char *)&matching,"Unknown targeting key %s.",pcVar3);
          curses_msgwin((char *)&matching);
        }
        else {
          for (lo_y = L'\0'; lo_y < L'\x02'; lo_y = lo_y + L'\x01') {
            if (lo_y == L'\0') {
              local_7c0 = L'\x14';
              lo_x = dx;
              local_7bc = dx;
            }
            else {
              local_7bc = L'\0';
              local_7c0 = dx;
              lo_x = local_7bc;
            }
            for (; lo_x <= local_7c0; lo_x = lo_x + L'\x01') {
              if ((lo_y == L'\0') && (lo_x == local_7bc)) {
                local_7c4 = key + L'\x01';
              }
              else {
                local_7c4 = L'\x01';
              }
              if ((lo_y == L'\x01') && (lo_x == local_7c0)) {
                local_7c8 = key;
              }
              else {
                local_7c8 = L'O';
              }
              for (pass = local_7c4; pass <= local_7c8; pass = pass + L'\x01') {
                iVar1 = (int)display_buffer[lo_x][pass].bg;
                if (((iVar1 != 0) && (*(char *)((long)pvStack_160 + (long)iVar1) != '\0')) ||
                   ((key_00 == L'^' && (display_buffer[lo_x][pass].trap != 0)))) {
                  key = pass;
                  dx = lo_x;
                  goto LAB_0010f11f;
                }
              }
            }
          }
          sprintf((char *)&matching,"Can\'t find dungeon feature \'%c\'.",
                  (ulong)(uint)(int)(char)key_00);
          curses_msgwin((char *)&matching);
        }
      }
    }
    else {
      if (key + sidx < 1) {
        sidx = L'\x01' - key;
      }
      if (0x4f < key + sidx) {
        sidx = L'O' - key;
      }
      if (dx + local_40 < 0) {
        local_40 = -dx;
      }
      if (0x14 < dx + local_40) {
        local_40 = 0x14 - dx;
      }
      key = sidx + key;
      dx = local_40 + dx;
    }
LAB_0010f11f:
    wmove(mapwin,dx,key + L'\xffffffff');
    wrefresh();
  }
  dx = L'\xfffffff6';
  key = L'\xfffffff6';
  cy = L'\xffffffff';
  goto LAB_0010f14b;
}

Assistant:

int curses_getpos(int *x, int *y, nh_bool force, const char *goal)
{
    int result = 0;
    int cx, cy;
    int key, dx, dy;
    int sidx;
    static const char pick_chars[] = " \r\n.,;:";
    static const int pick_vals[] = {1, 1, 1, 1, 2, 3, 4};
    const char *cp;
    char printbuf[BUFSZ];
    char *matching = NULL;
    enum nh_direction dir;
    struct coord *monpos = NULL;
    int moncount, monidx;
    nh_bool first_move = TRUE;

    werase(statuswin);
    mvwaddstr(statuswin, 0, 0, "Select a target location with the cursor: "
			       "'.' to confirm");
    if (!force) waddstr(statuswin, ", ESC to cancel.");
    else waddstr(statuswin, ".");
    mvwaddstr(statuswin, 1, 0, "Press '?' for help and tips.");
    wrefresh(statuswin);
    
    cx = *x >= 1 ? *x : player.x;
    cy = *y >= 0 ? *y : player.y;
    wmove(mapwin, cy, cx-1);
    
    while (1) {
	if (first_move) {
	    /* Give initial message a chance to be seen. */
	    first_move = FALSE;
	} else {
	    struct nh_desc_buf descbuf;
	    int mx = 0, my = 0;

	    /* Describe what's under the cursor in the status window. */
	    nh_describe_pos(cx, cy, &descbuf);

	    werase(statuswin);
	    place_desc_message(statuswin, &mx, &my, descbuf.effectdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.invisdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.mondesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.objdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.trapdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.bgdesc);
	    wrefresh(statuswin);

	    wmove(mapwin, cy, cx-1);
	}

	dx = dy = 0;
	key = get_map_key(FALSE);
	if (key == KEY_ESC) {
	    cx = cy = -10;
	    result = -1;
	    break;
	}
	
	if ((cp = strchr(pick_chars, (char)key)) != 0) {
	    result = pick_vals[cp - pick_chars];
	    break;
	}

	dir = key_to_dir(key);
	if (dir != DIR_NONE) {
	    dx = xdir[dir];
	    dy = ydir[dir];
	} else if ( (dir = key_to_dir(tolower((unsigned char)key))) != DIR_NONE ) {
	    /* a shifted movement letter */
	    dx = xdir[dir] * 8;
	    dy = ydir[dir] * 8;
	}
	
	if (dx || dy) {
	    /* truncate at map edge */
	    if (cx + dx < 1)
		dx = 1 - cx;
	    if (cx + dx > COLNO-1)
		dx = COLNO - 1 - cx;
	    if (cy + dy < 0)
		dy = -cy;
	    if (cy + dy > ROWNO-1)
		dy = ROWNO - 1 - cy;
	    cx += dx;
	    cy += dy;
	    goto nxtc;
	}

	if (key == 'm' || key == 'M') {
	    if (!monpos) {
		int i, j;
		moncount = 0;
		for (i = 0; i < ROWNO; i++)
		    for (j = 0; j < COLNO; j++)
			if (display_buffer[i][j].mon && (j != player.x || i != player.y))
			    moncount++;
		monpos = malloc(moncount * sizeof(struct coord));
		monidx = 0;
		for (i = 0; i < ROWNO; i++)
		    for (j = 0; j < COLNO; j++)
			if (display_buffer[i][j].mon && (j != player.x || i != player.y)) {
			    monpos[monidx].x = j;
			    monpos[monidx].y = i;
			    monidx++;
			}
		qsort(monpos, moncount, sizeof(struct coord), compare_coord_dist);
		/* ready this for first increment/decrement to change to zero */
		monidx = (key == 'm') ? -1 : 1;
	    }
	    
	    if (moncount) { /* there is at least one monster to move to */
		if (key == 'm') {
		    monidx = (monidx + 1) % moncount;
		} else {
		    monidx--;
		    if (monidx < 0) monidx += moncount;
		}
		cx = monpos[monidx].x;
		cy = monpos[monidx].y;
	    }
	} else if (key == '@') {
	    cx = player.x;
	    cy = player.y;
	} else if (key == '?') {
	    static struct nh_menuitem helpitems[] = {
		{0, MI_TEXT, "Move the cursor with the direction keys:"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "7 8 9   y k u"},
		{0, MI_TEXT, " \\|/     \\|/"},
		{0, MI_TEXT, "4- -6   h- -l"},
		{0, MI_TEXT, " /|\\     /|\\"},
		{0, MI_TEXT, "1 2 3   b j n"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "Hold shift to move the cursor further."},
		{0, MI_TEXT, "Confirm your chosen location with one of .,;:"},
		{0, MI_TEXT, "Cancel with ESC (not always possible)."},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "Targeting shortcuts:"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "@    self"},
		{0, MI_TEXT, "m/M  next/previous monster"},
		{0, MI_TEXT, "<    upstairs"},
		{0, MI_TEXT, ">    downstairs"},
		{0, MI_TEXT, "_    altar"},
		{0, MI_TEXT, "#    sink"},
		{0, MI_TEXT, "     (other dungeon symbols also work)"},
	    };
	    curses_display_menu(helpitems, ARRAY_SIZE(helpitems),
				"Targeting Help (default keys)",
				PICK_NONE, NULL);
	} else {
	    int k = 0, tx, ty;
	    int pass, lo_x, lo_y, hi_x, hi_y;
	    matching = malloc(default_drawing->num_bgelements);
	    memset(matching, 0, default_drawing->num_bgelements);
	    for (sidx = default_drawing->bg_feature_offset;
		 sidx < default_drawing->num_bgelements; sidx++)
		if (key == default_drawing->bgelements[sidx].ch)
		    matching[sidx] = (char) ++k;
	    if (k || key == '^') {
		for (pass = 0; pass <= 1; pass++) {
		    /* pass 0: just past current pos to lower right;
			pass 1: upper left corner to current pos */
		    lo_y = (pass == 0) ? cy : 0;
		    hi_y = (pass == 0) ? ROWNO - 1 : cy;
		    for (ty = lo_y; ty <= hi_y; ty++) {
			lo_x = (pass == 0 && ty == lo_y) ? cx + 1 : 1;
			hi_x = (pass == 1 && ty == hi_y) ? cx : COLNO - 1;
			for (tx = lo_x; tx <= hi_x; tx++) {
			    k = display_buffer[ty][tx].bg;
			    if ((k && matching[k]) ||
				(key == '^' && display_buffer[ty][tx].trap)) {
				cx = tx;
				cy = ty;
				goto nxtc;
			    }
			}	/* column */
		    }	/* row */
		}		/* pass */
		sprintf(printbuf, "Can't find dungeon feature '%c'.", (char)key);
		curses_msgwin(printbuf);
	    } else {
		sprintf(printbuf, "Unknown targeting key %s.",
			!force ? "(ESC to abort, '?' for help)" : "('?' for help)");
		curses_msgwin(printbuf);
	    }
	}

nxtc:
	wmove(mapwin, cy, cx-1);
	wrefresh(mapwin);
    }
    
    *x = cx;
    *y = cy;
    if (monpos)
	free(monpos);
    if (matching)
	free(matching);
    curses_update_status(NULL); /* clear the help message */
    return result;
}